

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_end_errorfn(void *parent,FILE *fp,int error,char *argval,char *progname)

{
  char *pcVar1;
  
  if (progname == (char *)0x0) {
    progname = "";
  }
  if (argval == (char *)0x0) {
    argval = "";
  }
  fprintf((FILE *)fp,"%s: ",progname);
  switch(error) {
  case 1:
    pcVar1 = "too many errors to display";
    goto LAB_001057b8;
  case 2:
    pcVar1 = "insufficent memory";
LAB_001057b8:
    fputs(pcVar1,(FILE *)fp);
    goto LAB_001057d6;
  case 3:
    pcVar1 = "unexpected argument \"%s\"";
    break;
  case 4:
    pcVar1 = "invalid option \"%s\"";
    break;
  case 5:
    pcVar1 = "option \"%s\" requires an argument";
    break;
  default:
    fprintf((FILE *)fp,"invalid option \"-%c\"",(ulong)(uint)error);
    goto LAB_001057d6;
  }
  fprintf((FILE *)fp,pcVar1,argval);
LAB_001057d6:
  fputc(10,(FILE *)fp);
  return;
}

Assistant:

static void arg_end_errorfn(
	void * parent,
	FILE * fp,
	int error,
	const char * argval,
	const char * progname) {
	/* suppress unreferenced formal parameter warning */
	(void)parent;

	progname = progname ? progname : "";
	argval = argval ? argval : "";

	fprintf(fp, "%s: ", progname);

	switch (error) {
		case ARG_ELIMIT:
			fputs("too many errors to display", fp);
			break;

		case ARG_EMALLOC:
			fputs("insufficent memory", fp);
			break;

		case ARG_ENOMATCH:
			fprintf(fp, "unexpected argument \"%s\"", argval);
			break;

		case ARG_EMISSARG:
			fprintf(fp, "option \"%s\" requires an argument", argval);
			break;

		case ARG_ELONGOPT:
			fprintf(fp, "invalid option \"%s\"", argval);
			break;

		default:
			fprintf(fp, "invalid option \"-%c\"", error);
			break;
	}

	fputc('\n', fp);
}